

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzer.cpp
# Opt level: O2

U8 __thiscall
LINAnalyzer::GetBreakField
          (LINAnalyzer *this,S64 *startingSample,S64 *endingSample,bool *framingError)

{
  LINAnalyzerResults *pLVar1;
  Channel *pCVar2;
  int iVar3;
  MarkerType MVar4;
  long lVar5;
  long lVar6;
  S64 SVar7;
  U32 num_break_bits;
  U32 i;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    iVar3 = AnalyzerChannelData::GetBitState();
    if (iVar3 == 1) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    lVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
    lVar6 = AnalyzerChannelData::GetSampleNumber();
    lVar5 = lVar5 - lVar6;
    auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar10._0_8_ = lVar5;
    auVar10._12_4_ = 0x45300000;
    dVar9 = SamplesPerBit(this);
    dVar9 = round(((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / dVar9);
  } while ((uint)(long)dVar9 < 0xd);
  SVar7 = AnalyzerChannelData::GetSampleNumber();
  *startingSample = SVar7;
  for (uVar8 = 0; (uint)(long)dVar9 != uVar8; uVar8 = uVar8 + 1) {
    if (uVar8 == 0) {
      AdvanceHalfBit(this);
    }
    else {
      Advance(this,1);
    }
    pLVar1 = (this->mResults)._M_ptr;
    MVar4 = AnalyzerChannelData::GetSampleNumber();
    iVar3 = AnalyzerChannelData::GetBitState();
    AnalyzerResults::AddMarker((ulonglong)pLVar1,MVar4,(Channel *)(ulong)(iVar3 == 1 ^ 0xb));
  }
  Advance(this,1);
  iVar3 = AnalyzerChannelData::GetBitState();
  pLVar1 = (this->mResults)._M_ptr;
  MVar4 = AnalyzerChannelData::GetSampleNumber();
  pCVar2 = (Channel *)0x9;
  if (iVar3 != 1) {
    pCVar2 = (Channel *)0x3;
  }
  AnalyzerResults::AddMarker((ulonglong)pLVar1,MVar4,pCVar2);
  *framingError = iVar3 != 1;
  SVar7 = AnalyzerChannelData::GetSampleNumber();
  *endingSample = SVar7;
  return '\0';
}

Assistant:

U8 LINAnalyzer::GetBreakField( S64& startingSample, S64& endingSample, bool& framingError )
{
    // locate the start bit (falling edge expected)...
    U32 min_break_field_low_bits =
        13; // as per the spec of LIN. at least 13 bits at master speed, but receiver only needs it to be 11 or more.
    U32 num_break_bits = 0;
    bool valid_fame = false;
    for( ;; )
    {
        mSerial->AdvanceToNextEdge();
        if( mSerial->GetBitState() == BIT_HIGH )
        {
            mSerial->AdvanceToNextEdge();
        }
        num_break_bits = round( double( mSerial->GetSampleOfNextEdge() - mSerial->GetSampleNumber() ) / SamplesPerBit() );
        if( num_break_bits >= min_break_field_low_bits )
        {
            startingSample = mSerial->GetSampleNumber();
            valid_fame = true;
            break;
        }
    }

    // AdvanceHalfBit( );
    // mResults->AddMarker( mSerial->GetSampleNumber( ), AnalyzerResults::Start, mSettings->mInputChannel );

    for( U32 i = 0; i < num_break_bits; i++ )
    {
        if( i == 0 )
            AdvanceHalfBit();
        else
            Advance( 1 );
        // let's put a dot exactly where we sample this bit:
        mResults->AddMarker( mSerial->GetSampleNumber(), mSerial->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero,
                             mSettings->mInputChannel );
    }

    // Validate the stop bit...
    Advance( 1 );
    if( mSerial->GetBitState() == BIT_HIGH )
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mInputChannel );
        framingError = false;
    }
    else
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::ErrorSquare, mSettings->mInputChannel );
        framingError = true;
    }

    endingSample = mSerial->GetSampleNumber();

    return ( valid_fame ) ? 0 : 1;
}